

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<2>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < *field) {
    lVar2 = 0;
    do {
      uVar5 = md->tag;
      pbVar3 = output->ptr;
      if (uVar5 < 0x80) {
        *pbVar3 = (byte)uVar5;
        pbVar3 = pbVar3 + 1;
      }
      else {
        *pbVar3 = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          pbVar3[1] = (byte)(uVar5 >> 7);
          pbVar3 = pbVar3 + 2;
        }
        else {
          pbVar3 = pbVar3 + 2;
          uVar5 = uVar5 >> 7;
          do {
            pbVar4 = pbVar3;
            pbVar4[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            pbVar3 = pbVar4 + 1;
            bVar1 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar1);
          *pbVar4 = (byte)uVar6;
        }
      }
      output->ptr = pbVar3;
      *(undefined4 *)pbVar3 = *(undefined4 *)(*(long *)((long)field + 8) + lVar2 * 4);
      output->ptr = pbVar3 + 4;
      lVar2 = lVar2 + 1;
    } while (lVar2 < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }